

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall ON_TextureMapping::ON_TextureMapping(ON_TextureMapping *this,ON_TextureMapping *src)

{
  long lVar1;
  ON_Xform *pOVar2;
  ON_Xform *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,TextureMapping,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00821f00;
  this->m_type = no_mapping;
  this->m_projection = no_projection;
  *(undefined8 *)((long)&this->m_projection + 1) = 0;
  pOVar2 = &ON_Xform::IdentityTransformation;
  pOVar3 = &this->m_Pxyz;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  pOVar2 = &ON_Xform::IdentityTransformation;
  pOVar3 = &this->m_Nxyz;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  pOVar2 = &ON_Xform::IdentityTransformation;
  pOVar3 = &this->m_uvw;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_type = src->m_type;
  this->m_projection = src->m_projection;
  this->m_bCapped = src->m_bCapped;
  this->m_texture_space = src->m_texture_space;
  pOVar2 = &src->m_Pxyz;
  pOVar3 = &this->m_Pxyz;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + (ulong)bVar4 * -0x10 + 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  pOVar2 = &src->m_Nxyz;
  pOVar3 = &this->m_Nxyz;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + (ulong)bVar4 * -0x10 + 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  pOVar2 = &src->m_uvw;
  pOVar3 = &this->m_uvw;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + (ulong)bVar4 * -0x10 + 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (src->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mapping_primitive).
              super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(src->m_mapping_primitive).
              super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ON_TextureMapping::ON_TextureMapping( const ON_TextureMapping& src)
  : ON_ModelComponent(ON_ModelComponent::Type::TextureMapping,src)
{
  Internal_CopyFrom(src);
}